

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O0

int quicly_loss_detect_loss
              (quicly_loss_t *loss,int64_t now,uint32_t max_ack_delay,int is_1rtt_only,
              quicly_loss_on_detect_cb on_loss_detected)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  quicly_loss_t *in_R8;
  bool bVar4;
  int64_t largest_acked_signed;
  int ret;
  quicly_sent_packet_t *sent;
  quicly_sentmap_iter_t iter;
  uint32_t delay_until_lost;
  int local_64;
  quicly_sent_packet_t *local_50;
  int in_stack_ffffffffffffffc0;
  quicly_sentmap_event_t in_stack_ffffffffffffffc4;
  quicly_sentmap_iter_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  if (*(uint *)(in_RDI + 100) < *(uint *)(in_RDI + 0x6c)) {
    local_64 = *(int *)(in_RDI + 0x6c);
  }
  else {
    local_64 = *(int *)(in_RDI + 100);
  }
  uVar2 = local_64 * 9 + 7U >> 3;
  *(undefined8 *)(in_RDI + 0x50) = 0x7fffffffffffffff;
  iVar3 = quicly_loss_init_sentmap_iter
                    (in_R8,(quicly_sentmap_iter_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (int64_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                     in_stack_ffffffffffffffc0);
  do {
    if (iVar3 != 0) {
      return iVar3;
    }
LAB_0015d09e:
    local_50 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x15d0a8);
    if (local_50->packet_number == 0xffffffffffffffff) {
LAB_0015d1a6:
      if (in_ECX == 0) {
        iVar3 = quicly_loss_init_sentmap_iter
                          (in_R8,(quicly_sentmap_iter_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                           (int64_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                           in_stack_ffffffffffffffc0);
        if (iVar3 != 0) {
          return iVar3;
        }
        local_50 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x15d1e8);
      }
      while( true ) {
        bVar4 = false;
        if (local_50->sent_at != 0x7fffffffffffffff) {
          bVar4 = local_50->packet_number + 1 <
                  *(ulong *)(in_RDI + 0x28 + (ulong)local_50->ack_epoch * 8);
        }
        if (!bVar4) break;
        if (local_50->cc_bytes_in_flight != 0) {
          if (in_RSI < (long)(local_50->sent_at + (ulong)uVar2)) {
            *(ulong *)(in_RDI + 0x50) = local_50->sent_at + (ulong)uVar2;
            return 0;
          }
          __assert_fail("now < sent->sent_at + delay_until_lost",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/loss.c"
                        ,0x5e,
                        "int quicly_loss_detect_loss(quicly_loss_t *, int64_t, uint32_t, int, quicly_loss_on_detect_cb)"
                       );
        }
        quicly_sentmap_skip((quicly_sentmap_iter_t *)0x15d2ab);
        local_50 = quicly_sentmap_get((quicly_sentmap_iter_t *)0x15d2b5);
      }
      return 0;
    }
    lVar1 = *(long *)(in_RDI + 0x28 + (ulong)local_50->ack_epoch * 8);
    if ((lVar1 + -1 <= (long)local_50->packet_number) ||
       (((long)(in_RSI - (ulong)uVar2) < local_50->sent_at &&
        (lVar1 + -4 < (long)local_50->packet_number)))) {
      if (in_ECX != 0) goto LAB_0015d1a6;
      quicly_sentmap_skip((quicly_sentmap_iter_t *)0x15d1a1);
      goto LAB_0015d09e;
    }
    if (local_50->cc_bytes_in_flight == 0) {
      quicly_sentmap_skip((quicly_sentmap_iter_t *)0x15d18c);
      goto LAB_0015d09e;
    }
    (*(code *)in_R8)(in_RDI,local_50,lVar1 + -4 < (long)local_50->packet_number);
    iVar3 = quicly_sentmap_update
                      ((quicly_sentmap_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  } while( true );
}

Assistant:

int quicly_loss_detect_loss(quicly_loss_t *loss, int64_t now, uint32_t max_ack_delay, int is_1rtt_only,
                            quicly_loss_on_detect_cb on_loss_detected)
{
    /* This function ensures that the value returned in loss_time is when the next application timer should be set for loss
     * detection. if no timer is required, loss_time is set to INT64_MAX. */

    const uint32_t delay_until_lost = ((loss->rtt.latest > loss->rtt.smoothed ? loss->rtt.latest : loss->rtt.smoothed) * 9 + 7) / 8;
    quicly_sentmap_iter_t iter;
    const quicly_sent_packet_t *sent;
    int ret;

    loss->loss_time = INT64_MAX;

    if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
        return ret;

    /* Mark packets as lost if they are smaller than the largest_acked and outside either time-threshold or packet-threshold
     * windows. Once marked as lost, cc_bytes_in_flight becomes zero. */
    while ((sent = quicly_sentmap_get(&iter))->packet_number != UINT64_MAX) {
        int64_t largest_acked_signed = loss->largest_acked_packet_plus1[sent->ack_epoch] - 1;
        if ((int64_t)sent->packet_number < largest_acked_signed &&
            (sent->sent_at <= now - delay_until_lost ||                                                      /* time threshold */
             (int64_t)sent->packet_number <= largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD)) { /* packet threshold */
            if (sent->cc_bytes_in_flight != 0) {
                on_loss_detected(loss, sent,
                                 (int64_t)sent->packet_number > largest_acked_signed - QUICLY_LOSS_DEFAULT_PACKET_THRESHOLD);
                if ((ret = quicly_sentmap_update(&loss->sentmap, &iter, QUICLY_SENTMAP_EVENT_LOST)) != 0)
                    return ret;
            } else {
                quicly_sentmap_skip(&iter);
            }
        } else {
            /* When only one PN space is active, it is possible to stop looking for packets that have to be considered lost and
             * continue on to calculating the loss time. Otherwise, iterate through the entire sentmap. */
            if (is_1rtt_only)
                break;
            quicly_sentmap_skip(&iter);
        }
    }

    if (!is_1rtt_only) {
        if ((ret = quicly_loss_init_sentmap_iter(loss, &iter, now, max_ack_delay, 0)) != 0)
            return ret;
        sent = quicly_sentmap_get(&iter);
    }

    /* schedule time-threshold alarm if there is a packet outstanding that is smaller than largest_acked */
    while (sent->sent_at != INT64_MAX && sent->packet_number + 1 < loss->largest_acked_packet_plus1[sent->ack_epoch]) {
        if (sent->cc_bytes_in_flight != 0) {
            assert(now < sent->sent_at + delay_until_lost);
            loss->loss_time = sent->sent_at + delay_until_lost;
            break;
        }
        quicly_sentmap_skip(&iter);
        sent = quicly_sentmap_get(&iter);
    }

    return 0;
}